

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::columnCountChanged(QTreeView *this,int oldCount,int newCount)

{
  QWidget *this_00;
  
  if (0 < newCount && oldCount == 0) {
    QAbstractItemViewPrivate::doDelayedItemsLayout
              (*(QAbstractItemViewPrivate **)
                &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                 super_QWidget.field_0x8,0);
  }
  if ((((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.data)->
       widget_attributes & 0x8000) != 0) {
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x268))(this);
  }
  this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  QWidget::update(this_00);
  return;
}

Assistant:

void QTreeView::columnCountChanged(int oldCount, int newCount)
{
    Q_D(QTreeView);
    if (oldCount == 0 && newCount > 0) {
        //if the first column has just been added we need to relayout.
        d->doDelayedItemsLayout();
    }

    if (isVisible())
        updateGeometries();
    viewport()->update();
}